

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HubContext.cpp
# Opt level: O1

error_code __thiscall
SL::WS_LITE::TLSContext::use_certificate_file
          (TLSContext *this,string *filename,file_format format,error_code *ec)

{
  element_type *peVar1;
  pointer psVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  shared_ptr<SL::WS_LITE::ThreadContext> *a;
  pointer psVar5;
  error_code eVar6;
  error_code eVar7;
  undefined1 auVar8 [12];
  
  uVar4 = std::_V2::system_category();
  peVar1 = (this->HubContext_).
           super___shared_ptr<SL::WS_LITE::HubContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  psVar5 = (peVar1->ThreadContexts).
           super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar2 = (peVar1->ThreadContexts).
           super__Vector_base<std::shared_ptr<SL::WS_LITE::ThreadContext>,_std::allocator<std::shared_ptr<SL::WS_LITE::ThreadContext>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar5 == psVar2) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar4;
    eVar6 = (error_code)(auVar3 << 0x40);
  }
  else {
    do {
      eVar6 = asio::ssl::context::use_certificate_file
                        (&((psVar5->
                           super___shared_ptr<SL::WS_LITE::ThreadContext,_(__gnu_cxx::_Lock_policy)2>
                           )._M_ptr)->context,filename,format,ec);
      psVar5 = psVar5 + 1;
    } while (psVar5 != psVar2);
  }
  eVar7._M_value = eVar6._M_value;
  auVar8._4_4_ = eVar6._4_4_;
  eVar7._M_cat = eVar6._M_cat;
  return eVar7;
}

Assistant:

virtual std::error_code use_certificate_file(const std::string &filename, file_format format, std::error_code &ec) override
        {
            std::error_code e;
            for (auto &a : HubContext_->ThreadContexts) {
                e = a->context.use_certificate_file(filename, static_cast<asio::ssl::context_base::file_format>(format), ec);
            }
            return e;
        }